

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gles2::Performance::ShaderCompilerLoopCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerLoopCase *this,int measurementNdx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  float *pfVar10;
  uint cacheAvoidanceID;
  float *pfVar11;
  int in_R9D;
  string *shaderSourceTemplate;
  Vector<float,_16> result;
  string nameSpec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  float local_148 [10];
  int local_120;
  LoopType local_11c;
  undefined1 local_118 [36];
  float fStack_f4;
  size_type sStack_f0;
  size_type local_e8;
  float afStack_e0 [2];
  float local_d8 [2];
  float afStack_d0 [2];
  float local_c8 [2];
  float afStack_c0 [6];
  float local_a8 [8];
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  local_88;
  string local_70;
  float local_50 [8];
  
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar7 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar7 = (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar7 ^ uVar7 >> 0xf;
  }
  getNameSpecialization_abi_cxx11_(&local_70,(Performance *)(ulong)cacheAvoidanceID,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loopVertexTemplate_abi_cxx11_
            ((string *)local_168,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  specializeShaderSource
            ((string *)local_118,(string *)local_168,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_118);
  pcVar2 = local_118 + 0x10;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (local_168 != (undefined1  [8])(local_168 + 0x10)) {
    operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
  }
  loopFragmentTemplate_abi_cxx11_
            ((string *)local_168,(Performance *)(ulong)this->m_type,(uint)this->m_isVertexCase,
             SUB41(this->m_numLoopIterations,0),this->m_nestingDepth,in_R9D);
  shaderSourceTemplate = (string *)local_168;
  specializeShaderSource
            ((string *)local_118,shaderSourceTemplate,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (local_168 != (undefined1  [8])(local_168 + 0x10)) {
    operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
  }
  local_120 = this->m_numLoopIterations;
  local_11c = this->m_type;
  local_88.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_188,"a_position",&local_70);
  local_50[4] = -1.0;
  local_50[5] = -1.0;
  local_50[6] = 0.0;
  local_50[7] = 1.0;
  local_50[0] = -1.0;
  local_50[1] = 1.0;
  local_50[2] = 0.0;
  local_50[3] = 1.0;
  pfVar3 = local_a8 + 4;
  local_a8[4] = 1.0;
  local_a8[5] = -1.0;
  local_a8[6] = 0.0;
  local_a8[7] = 1.0;
  local_a8[0] = 1.0;
  local_a8[1] = 1.0;
  local_a8[2] = 0.0;
  local_a8[3] = 1.0;
  local_168 = (undefined1  [8])0x0;
  uStack_160 = 0;
  local_158._M_allocated_capacity = 0;
  local_158._8_8_ = 0;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_148[4] = 0.0;
  local_148[5] = 0.0;
  local_148[6] = 0.0;
  local_148[7] = 0.0;
  lVar9 = 0;
  do {
    iVar8 = (int)lVar9;
    pfVar10 = local_50 + 4;
    if (((iVar8 != 0) && (pfVar10 = local_50, iVar8 != 1)) && (pfVar10 = local_a8, iVar8 == 2)) {
      pfVar10 = pfVar3;
    }
    fVar4 = pfVar10[1];
    fVar5 = pfVar10[2];
    fVar6 = pfVar10[3];
    *(float *)&(shaderSourceTemplate->_M_dataplus)._M_p = *pfVar10;
    *(float *)((long)&(shaderSourceTemplate->_M_dataplus)._M_p + 4) = fVar4;
    *(float *)&shaderSourceTemplate->_M_string_length = fVar5;
    *(float *)((long)&shaderSourceTemplate->_M_string_length + 4) = fVar6;
    lVar9 = lVar9 + 1;
    shaderSourceTemplate = (string *)&shaderSourceTemplate->field_2;
  } while (lVar9 != 4);
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,local_188._M_dataplus._M_p,
             local_188._M_dataplus._M_p + local_188._M_string_length);
  local_c8[0] = local_148[4];
  local_c8[1] = local_148[5];
  afStack_c0[0] = local_148[6];
  afStack_c0[1] = local_148[7];
  local_d8[0] = local_148[0];
  local_d8[1] = local_148[1];
  afStack_d0[0] = local_148[2];
  afStack_d0[1] = local_148[3];
  local_e8 = local_158._M_allocated_capacity;
  afStack_e0[0] = (float)local_158._8_4_;
  afStack_e0[1] = (float)local_158._12_4_;
  stack0xffffffffffffff08 = (pointer)local_168;
  sStack_f0 = uStack_160;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            (&local_88,(AttribSpec *)local_118);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  paVar1 = &local_188.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_188,"a_value",&local_70);
  local_50[4] = 1.0;
  local_50[5] = 1.0;
  local_50[6] = 1.0;
  local_50[7] = 1.0;
  local_50[0] = 1.0;
  local_50[1] = 1.0;
  local_50[2] = 1.0;
  local_50[3] = 1.0;
  local_a8[4] = 1.0;
  local_a8[5] = 1.0;
  local_a8[6] = 1.0;
  local_a8[7] = 1.0;
  local_a8[0] = 1.0;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_a8[3] = 1.0;
  pfVar10 = (float *)local_168;
  local_168 = (undefined1  [8])0x0;
  uStack_160 = 0;
  local_158._M_allocated_capacity = 0;
  local_158._8_8_ = 0;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_148[4] = 0.0;
  local_148[5] = 0.0;
  local_148[6] = 0.0;
  local_148[7] = 0.0;
  lVar9 = 0;
  do {
    iVar8 = (int)lVar9;
    pfVar11 = local_50 + 4;
    if (((iVar8 != 0) && (pfVar11 = local_50, iVar8 != 1)) && (pfVar11 = local_a8, iVar8 == 2)) {
      pfVar11 = pfVar3;
    }
    fVar4 = pfVar11[1];
    fVar5 = pfVar11[2];
    fVar6 = pfVar11[3];
    *pfVar10 = *pfVar11;
    pfVar10[1] = fVar4;
    pfVar10[2] = fVar5;
    pfVar10[3] = fVar6;
    lVar9 = lVar9 + 1;
    pfVar10 = pfVar10 + 4;
  } while (lVar9 != 4);
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,local_188._M_dataplus._M_p,
             local_188._M_dataplus._M_p + local_188._M_string_length);
  local_c8[0] = local_148[4];
  local_c8[1] = local_148[5];
  afStack_c0[0] = local_148[6];
  afStack_c0[1] = local_148[7];
  local_d8[0] = local_148[0];
  local_d8[1] = local_148[1];
  afStack_d0[0] = local_148[2];
  afStack_d0[1] = local_148[3];
  local_e8 = local_158._M_allocated_capacity;
  afStack_e0[0] = (float)local_158._8_4_;
  afStack_e0[1] = (float)local_158._12_4_;
  stack0xffffffffffffff08 = (pointer)local_168;
  sStack_f0 = uStack_160;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            (&local_88,(AttribSpec *)local_118);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if (local_11c == LOOP_TYPE_DYNAMIC) {
    std::operator+(&local_188,"a_loopBound",&local_70);
    local_50[4] = (float)local_120;
    lVar9 = 0;
    local_50[5] = 0.0;
    local_50[6] = 0.0;
    local_50[7] = 0.0;
    local_50[0] = local_50[4];
    local_50[1] = 0.0;
    local_50[2] = 0.0;
    local_50[3] = 0.0;
    local_a8[4] = local_50[4];
    local_a8[5] = 0.0;
    local_a8[6] = 0.0;
    local_a8[7] = 0.0;
    local_a8[0] = local_50[4];
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    local_a8[3] = 0.0;
    pfVar10 = (float *)local_168;
    local_148[4] = 0.0;
    local_148[5] = 0.0;
    local_148[6] = 0.0;
    local_148[7] = 0.0;
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    local_148[2] = 0.0;
    local_148[3] = 0.0;
    local_158._M_allocated_capacity = 0;
    local_158._8_8_ = 0;
    local_168 = (undefined1  [8])0x0;
    uStack_160 = 0;
    do {
      iVar8 = (int)lVar9;
      pfVar11 = local_50 + 4;
      if (((iVar8 != 0) && (pfVar11 = local_50, iVar8 != 1)) && (pfVar11 = local_a8, iVar8 == 2)) {
        pfVar11 = pfVar3;
      }
      fVar4 = pfVar11[1];
      fVar5 = pfVar11[2];
      fVar6 = pfVar11[3];
      *pfVar10 = *pfVar11;
      pfVar10[1] = fVar4;
      pfVar10[2] = fVar5;
      pfVar10[3] = fVar6;
      lVar9 = lVar9 + 1;
      pfVar10 = pfVar10 + 4;
    } while (lVar9 != 4);
    local_118._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    local_c8[0] = local_148[4];
    local_c8[1] = local_148[5];
    afStack_c0[0] = local_148[6];
    afStack_c0[1] = local_148[7];
    local_d8[0] = local_148[0];
    local_d8[1] = local_148[1];
    afStack_d0[0] = local_148[2];
    afStack_d0[1] = local_148[3];
    local_e8 = local_158._M_allocated_capacity;
    afStack_e0[0] = (float)local_158._8_4_;
    afStack_e0[1] = (float)local_158._12_4_;
    stack0xffffffffffffff08 = (pointer)local_168;
    sStack_f0 = uStack_160;
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
    ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
              (&local_88,(AttribSpec *)local_118);
    if ((pointer)local_118._0_8_ != pcVar2) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar1) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
  }
  local_118._0_8_ =
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_118._8_8_ =
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_118._16_8_ =
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_118);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector(&local_88);
  iVar8 = this->m_numLoopIterations;
  local_188.field_2._M_allocated_capacity = 0;
  local_188._M_dataplus._M_p = (pointer)0x0;
  local_188._M_string_length = 0;
  if (this->m_type == LOOP_TYPE_UNIFORM) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                   "u_loopBound",&local_70);
    local_118._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,local_168,(pointer)((long)local_168 + uStack_160));
    stack0xffffffffffffff08 = (pointer)((ulong)stack0xffffffffffffff08 & 0xffffffff00000000);
    lVar9 = 9;
    do {
      *(float *)(local_118 + lVar9 * 4) = (float)iVar8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x19);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
              ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                *)&local_188,(UniformSpec *)local_118);
    if ((pointer)local_118._0_8_ != pcVar2) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    if (local_168 != (undefined1  [8])(local_168 + 0x10)) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
  }
  local_118._0_8_ =
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_118._8_8_ =
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_118._16_8_ =
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._M_dataplus._M_p;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._M_string_length;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_188.field_2._M_allocated_capacity;
  local_188._M_dataplus._M_p = (pointer)0x0;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity = 0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)local_118);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerLoopCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(loopVertexTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(loopFragmentTemplate(m_type, m_isVertexCase, m_numLoopIterations, m_nestingDepth), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes		= loopShaderAttributes(nameSpec, m_type, m_numLoopIterations);
	result.uniforms				= loopShaderUniforms(nameSpec, m_type, m_numLoopIterations);

	return result;
}